

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::ParquetReader::CreateReader(ParquetReader *this,ClientContext *context)

{
  size_type __n;
  ParquetColumnSchema *args;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var2;
  pointer pCVar3;
  StructColumnReader *pSVar4;
  reference pvVar5;
  pointer pEVar6;
  InternalException *this_00;
  ClientContext *in_RDX;
  _Prime_rehash_policy *p_Var7;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> local_78;
  templated_unique_single_t expr_schema;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  ClientContext *local_58;
  string local_50;
  
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  operator*((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             *)&(context->config).set_variables._M_h._M_bucket_count);
  local_58 = in_RDX;
  CreateReaderRecursive
            (this,context,(vector<duckdb::ColumnIndex,_true> *)in_RDX,
             (ParquetColumnSchema *)&(context->config).profiler_save_location.field_2);
  pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)this);
  if ((pCVar3->column_schema->type).id_ != STRUCT) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Root element of Parquet file must be a struct",
               (allocator *)&expr_schema);
    InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)this);
  pSVar4 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar3);
  p_Var7 = &(context->config).profiler_settings._M_h._M_rehash_policy;
  while (p_Var7 = *(_Prime_rehash_policy **)p_Var7, p_Var7 != (_Prime_rehash_policy *)0x0) {
    __n = p_Var7->_M_next_resize;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
             ::get<true>(&pSVar4->child_readers,__n);
    local_50._M_dataplus._M_p =
         (pointer)(pvVar5->
                  super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
                  .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
    (pvVar5->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
    _M_t.super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
    super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)0x0;
    pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
             operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                         *)&local_50);
    args = pCVar3->column_schema;
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(p_Var7 + 1));
    local_78._M_head_impl._0_4_ = 3;
    make_uniq<duckdb::ParquetColumnSchema,duckdb::ParquetColumnSchema_const&,duckdb::LogicalType&,duckdb::ParquetColumnSchemaType>
              ((duckdb *)&expr_schema,args,&pEVar6->return_type,(ParquetColumnSchemaType *)&local_78
              );
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(p_Var7 + 1));
    (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_60,pEVar6);
    make_uniq<duckdb::ExpressionColumnReader,duckdb::ClientContext&,duckdb::unique_ptr<duckdb::ColumnReader,std::default_delete<duckdb::ColumnReader>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::ParquetColumnSchema,std::default_delete<duckdb::ParquetColumnSchema>,true>>
              ((duckdb *)&local_78,local_58,
               (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
               &local_50,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_60,&expr_schema);
    if (local_60._M_head_impl != (Expression *)0x0) {
      (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    _Var2._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (ColumnReader *)0x0;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
             ::get<true>(&pSVar4->child_readers,__n);
    _Var1._M_head_impl =
         (pvVar5->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
         super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
    (pvVar5->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
    _M_t.super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
    super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ColumnReader *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnReader + 8))();
    }
    if (local_78._M_head_impl != (ColumnReader *)0x0) {
      (*(local_78._M_head_impl)->_vptr_ColumnReader[1])();
    }
    ::std::
    unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>::
    ~unique_ptr(&expr_schema.
                 super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
               );
    if ((ColumnReader *)local_50._M_dataplus._M_p != (ColumnReader *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> ParquetReader::CreateReader(ClientContext &context) {
	auto ret = CreateReaderRecursive(context, column_indexes, *root_schema);
	if (ret->Type().id() != LogicalTypeId::STRUCT) {
		throw InternalException("Root element of Parquet file must be a struct");
	}
	// add expressions if required
	auto &root_struct_reader = ret->Cast<StructColumnReader>();
	for (auto &entry : expression_map) {
		auto column_id = entry.first;
		auto &expression = entry.second;
		auto child_reader = std::move(root_struct_reader.child_readers[column_id]);
		auto expr_schema = make_uniq<ParquetColumnSchema>(child_reader->Schema(), expression->return_type,
		                                                  ParquetColumnSchemaType::EXPRESSION);
		auto expr_reader = make_uniq<ExpressionColumnReader>(context, std::move(child_reader), expression->Copy(),
		                                                     std::move(expr_schema));
		root_struct_reader.child_readers[column_id] = std::move(expr_reader);
	}
	return ret;
}